

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *
tinyusdz::tydra::GetGeomSubsetChildren
          (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
           *__return_storage_ptr__,Prim *prim,token *familyName,bool prim_must_be_geommesh)

{
  vtable_type *pvVar1;
  pointer pPVar2;
  bool bVar3;
  __type _Var4;
  uint32_t uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined3 in_register_00000009;
  Prim *p;
  pointer this;
  GeomSubset *pv;
  GeomSubset *local_60;
  optional<tinyusdz::Token> local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (CONCAT31(in_register_00000009,prim_must_be_geommesh) != 0) {
    pvVar1 = (prim->_data).v_.vtable;
    if (pvVar1 == (vtable_type *)0x0) {
      return __return_storage_ptr__;
    }
    uVar5 = (*pvVar1->type_id)();
    if (uVar5 != 0x405) {
      return __return_storage_ptr__;
    }
  }
  this = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
         _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this == pPVar2) {
      return __return_storage_ptr__;
    }
    local_60 = Prim::as<tinyusdz::GeomSubset>(this);
    if (local_60 != (GeomSubset *)0x0) {
      if (((familyName->str_)._M_string_length == 0) ||
         (bVar3 = TypedAttribute<tinyusdz::Token>::authored(&local_60->familyName), !bVar3)) {
LAB_0028f4d1:
        ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
        push_back(__return_storage_ptr__,&local_60);
      }
      else {
        nonstd::optional_lite::optional<tinyusdz::Token>::optional
                  (&local_58,&(local_60->familyName)._attrib);
        bVar3 = local_58.has_value_;
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_58);
        if (bVar3 == true) {
          nonstd::optional_lite::optional<tinyusdz::Token>::optional
                    (&local_58,&(local_60->familyName)._attrib);
          __rhs = &nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_58)->str_;
          nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_58);
          _Var4 = ::std::operator==(&familyName->str_,__rhs);
          if (_Var4) goto LAB_0028f4d1;
        }
      }
    }
    this = this + 1;
  } while( true );
}

Assistant:

std::vector<const GeomSubset *> GetGeomSubsetChildren(
    const tinyusdz::Prim &prim, const tinyusdz::value::token &familyName,
    bool prim_must_be_geommesh) {
  std::vector<const GeomSubset *> result;

  if (prim_must_be_geommesh && !prim.is<GeomMesh>()) {
    return result;
  }

  // Only account for child Prims.
  for (const auto &p : prim.children()) {
    if (auto pv = p.as<GeomSubset>()) {
      if (familyName.valid()) {
        if (pv->familyName.authored()) {
          if (pv->familyName.get_value().has_value()) {
            const value::token &tok = pv->familyName.get_value().value();
            if (familyName.str() == tok.str()) {
              result.push_back(pv);
            }
          } else {
            // connection attr or value block?
            // skip adding this GeomSubset.
          }
        } else {
          result.push_back(pv);
        }
      } else {
        result.push_back(pv);
      }
    }
  }

  return result;
}